

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  uint8_t *puVar3;
  uint16_t uVar4;
  DecodeStatus DVar5;
  uint8_t *orig_p;
  MCRegisterClass *pMVar6;
  byte bVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  uint64_t Value_5;
  uint uVar11;
  ulong unaff_RBP;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint8_t *orig_p_2;
  ulong uVar16;
  byte *pbVar17;
  uint8_t *puVar18;
  uint64_t Value_1;
  int iVar19;
  int local_4c;
  
  if (1 < code_len) {
    unaff_RBP = (ulong)*(ushort *)code;
  }
  uVar11 = (uint)unaff_RBP;
  if (1 < code_len) {
    __s = MI->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
    }
    uVar9 = uVar11 & 0xffff;
    uVar15 = 0;
    local_4c = 3;
    puVar3 = DecoderTable16;
LAB_001c597a:
    puVar18 = puVar3;
    switch(*puVar18) {
    case '\x01':
      uVar15 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x10) {
        uVar15 = 0xffff;
      }
      uVar15 = (uVar15 & uVar9) >> (puVar18[1] & 0x1f);
      puVar3 = puVar18 + 3;
      goto LAB_001c597a;
    case '\x02':
      uVar14 = 0;
      uVar12 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar14 + 1;
        uVar12 = uVar12 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar14 = uVar14 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3;
      if ((uVar12 & 0xffff) != uVar15) {
        puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3 +
                 *(ushort *)(puVar18 + (uVar14 & 0xffffffff) + 1);
      }
      goto LAB_001c597a;
    case '\x03':
      uVar12 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x10) {
        uVar12 = 0xffff;
      }
      uVar14 = 0;
      uVar13 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar14 + 3;
        uVar13 = uVar13 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar14 = uVar14 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      puVar3 = puVar18 + (uVar14 & 0xffffffff) + 5;
      if ((uVar12 & uVar9) >> (puVar18[1] & 0x1f) != uVar13) {
        puVar3 = puVar18 + (uVar14 & 0xffffffff) + 5 +
                 *(ushort *)(puVar18 + (uVar14 & 0xffffffff) + 3);
      }
      goto LAB_001c597a;
    case '\x04':
      uVar14 = 0;
      do {
        lVar2 = uVar14 + 1;
        uVar14 = uVar14 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3;
      goto LAB_001c597a;
    case '\x05':
      goto switchD_001c5990_caseD_5;
    case '\x06':
      uVar14 = 0;
      uVar12 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar14 + 1;
        uVar12 = uVar12 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar14 = uVar14 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      uVar16 = 0;
      uVar13 = 0;
      bVar7 = 0;
      do {
        lVar2 = uVar16 + (uVar14 & 0xffffffff) + 1;
        uVar13 = uVar13 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
        bVar7 = bVar7 + 7;
        uVar16 = uVar16 + 1;
      } while ((char)puVar18[lVar2] < '\0');
      puVar3 = puVar18 + (uVar16 & 0xffffffff) + (uVar14 & 0xffffffff) + 1;
      if ((uVar13 & (uVar9 ^ 0xffff)) != 0 || (uVar12 & uVar9) != 0) {
        local_4c = 1;
      }
      goto LAB_001c597a;
    default:
      goto switchD_001c5990_default;
    }
  }
  goto LAB_001c646a;
switchD_001c5f22_caseD_5:
  uVar14 = 0;
  uVar15 = 0;
  bVar7 = 0;
  do {
    lVar2 = uVar14 + 1;
    uVar15 = uVar15 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    uVar14 = uVar14 + 1;
  } while ((char)puVar18[lVar2] < '\0');
  pbVar17 = puVar18 + (uVar14 & 0xffffffff) + 1;
  iVar10 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar17;
    iVar10 = iVar10 + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    pbVar17 = pbVar17 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,uVar15);
  if (0x23 < iVar10 - 1U) goto LAB_001c645d;
  pvVar8 = (void *)((long)&switchD_001c60f7::switchdataD_00257930 +
                   (long)(int)(&switchD_001c60f7::switchdataD_00257930)[iVar10 - 1U]);
  switch(iVar10) {
  case 1:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 & 0xf,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar5 = Decode2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar5 = Decode2RUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar5 = DecodeR2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar5 = Decode3RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar5 = Decode2RImmInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar5 = Decode2RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar5 = DecodeRUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001c61ea;
  case 0xb:
    uVar14 = (ulong)(uVar11 & 0x3f);
    goto LAB_001c6450;
  case 0xc:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
LAB_001c61ea:
    if (DVar5 != MCDisassembler_Fail) {
      uVar14 = (ulong)(uVar11 & 0x3f);
      goto LAB_001c6450;
    }
    goto switchD_001c5f22_default;
  case 0xd:
    uVar14 = (ulong)(uVar11 & 0x3f);
    goto LAB_001c6415;
  case 0xe:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 6 & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar11 = uVar11 & 0x3f;
LAB_001c638f:
      uVar14 = -(ulong)uVar11;
      goto LAB_001c6450;
    }
    goto switchD_001c5f22_default;
  case 0xf:
    DVar5 = DecodeRUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar5 = Decode2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar5 = Decode3RImmInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x12:
    uVar14 = (ulong)(uVar11 & 0x3ff);
    goto LAB_001c6450;
  case 0x13:
    uVar14 = (ulong)(uVar11 & 0x3ff);
    goto LAB_001c6415;
  case 0x14:
    DVar5 = DecodeL2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar5 = DecodeL3RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar5 = DecodeL4RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar5 = DecodeL5RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar5 = DecodeL6RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar5 = DecodeLR2RInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001c6439;
  case 0x1c:
    uVar15 = (uVar11 & 0x3ff) << 6;
    uVar11 = uVar11 >> 0x10 & 0x3f;
    goto LAB_001c614d;
  case 0x1d:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
LAB_001c6439:
    if (DVar5 != MCDisassembler_Fail) {
      uVar14 = (ulong)(uVar11 >> 0x10 & 0x3f | (uVar11 & 0x3ff) << 6);
      goto LAB_001c6450;
    }
    goto switchD_001c5f22_default;
  case 0x1e:
    uVar15 = (uVar11 & 0x3ff) << 6;
    uVar11 = uVar11 >> 0x10 & 0x3f;
    goto LAB_001c6413;
  case 0x1f:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11 >> 0x16 & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar11 = uVar11 >> 0x10 & 0x3f | (uVar11 & 0x3ff) << 6;
      goto LAB_001c638f;
    }
switchD_001c5f22_default:
    iVar19 = 0;
    goto LAB_001c645d;
  case 0x20:
    DVar5 = DecodeL2RUSBitpInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar5 = DecodeL2RUSInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar5 = DecodeL3RSrcDstInstruction(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar15 = (uVar11 & 0x3ff) << 10;
    uVar11 = uVar11 >> 0x10 & 0x3ff;
LAB_001c614d:
    uVar14 = (ulong)(uVar11 | uVar15);
    goto LAB_001c6450;
  case 0x24:
    uVar15 = (uVar11 & 0x3ff) << 10;
    uVar11 = uVar11 >> 0x10 & 0x3ff;
LAB_001c6413:
    uVar14 = (ulong)(uVar11 | uVar15);
LAB_001c6415:
    uVar14 = -uVar14;
LAB_001c6450:
    MCOperand_CreateImm0(MI,uVar14);
    goto LAB_001c645d;
  }
  if (DVar5 == MCDisassembler_Fail) {
    iVar19 = 0;
  }
LAB_001c645d:
  uVar4 = 4;
  if (iVar19 == 0) {
LAB_001c646a:
    uVar15 = 0;
    goto LAB_001c646c;
  }
  goto LAB_001c5ec0;
switchD_001c5990_caseD_5:
  uVar14 = 0;
  uVar15 = 0;
  bVar7 = 0;
  do {
    lVar2 = uVar14 + 1;
    uVar15 = uVar15 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    uVar14 = uVar14 + 1;
  } while ((char)puVar18[lVar2] < '\0');
  pbVar17 = puVar18 + (uVar14 & 0xffffffff) + 1;
  iVar19 = 0;
  bVar7 = 0;
  do {
    bVar1 = *pbVar17;
    iVar19 = iVar19 + ((bVar1 & 0x7f) << (bVar7 & 0x1f));
    bVar7 = bVar7 + 7;
    pbVar17 = pbVar17 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,uVar15);
  if (0x23 < iVar19 - 1U) goto LAB_001c5eb8;
  pvVar8 = (void *)((long)&switchD_001c5b85::switchdataD_00257888 +
                   (long)(int)(&switchD_001c5b85::switchdataD_00257888)[iVar19 - 1U]);
  switch(iVar19) {
  case 1:
    uVar11 = uVar11 & 0xf;
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar11,(uint64_t)info,pvVar8);
    break;
  case 2:
    DVar5 = Decode2RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 3:
    DVar5 = Decode2RUSInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 4:
    DVar5 = DecodeR2RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 5:
    DVar5 = Decode3RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 6:
    DVar5 = Decode2RImmInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 7:
    DVar5 = Decode2RSrcDstInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 8:
    DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 9:
    DVar5 = DecodeRUSInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 10:
    DVar5 = DecodeRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
    goto LAB_001c5c52;
  case 0xb:
    uVar16 = (ulong)(uVar11 & 0x3f);
    uVar14 = uVar16;
    goto LAB_001c5eaf;
  case 0xc:
    DVar5 = DecodeGRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
LAB_001c5c52:
    if (DVar5 != MCDisassembler_Fail) {
      uVar16 = (ulong)(uVar11 & 0x3f);
      uVar14 = uVar16;
      goto LAB_001c5eaf;
    }
switchD_001c5990_default:
    local_4c = 0;
    goto LAB_001c5eb8;
  case 0xd:
    uVar11 = uVar11 & 0x3f;
    goto LAB_001c5db7;
  case 0xe:
    DVar5 = DecodeGRRegsRegisterClass(MI,(uint)(unaff_RBP >> 6) & 0xf,(uint64_t)info,pvVar8);
    if (DVar5 != MCDisassembler_Fail) {
      uVar16 = -(ulong)(uVar11 & 0x3f);
      uVar14 = uVar16;
      goto LAB_001c5eaf;
    }
    goto switchD_001c5990_default;
  case 0xf:
    DVar5 = DecodeRUSBitpInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x10:
    DVar5 = Decode2RUSBitpInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x11:
    DVar5 = Decode3RImmInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x12:
    uVar16 = (ulong)(uVar11 & 0x3ff);
    uVar14 = uVar16;
    goto LAB_001c5eaf;
  case 0x13:
    uVar11 = uVar11 & 0x3ff;
LAB_001c5db7:
    uVar16 = -(ulong)uVar11;
    uVar14 = uVar16;
    goto LAB_001c5eaf;
  case 0x14:
    DVar5 = DecodeL2RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x15:
    DVar5 = DecodeL3RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x16:
    DVar5 = DecodeL4RSrcDstInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x17:
    DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x18:
    DVar5 = DecodeL5RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x19:
    DVar5 = DecodeL6RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x1a:
    DVar5 = DecodeLR2RInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x1b:
    uVar15 = 0;
    goto LAB_001c5e8d;
  case 0x1c:
    uVar11 = uVar11 << 6;
    goto LAB_001c5bb0;
  case 0x1d:
    uVar15 = 1;
LAB_001c5e8d:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar15);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar14 = (ulong)(ushort)(uVar11 << 6);
LAB_001c5eac:
    uVar16 = (ulong)(uVar11 << 6);
    goto LAB_001c5eaf;
  case 0x1e:
    uVar11 = uVar11 << 6;
    goto LAB_001c5e79;
  case 0x1f:
    pMVar6 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,1);
    MCOperand_CreateReg0(MI,(uint)*pMVar6->RegsBegin);
    uVar14 = -(ulong)(ushort)(uVar11 << 6);
    goto LAB_001c5eac;
  case 0x20:
    DVar5 = DecodeL2RUSBitpInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x21:
    DVar5 = DecodeL2RUSInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x22:
    DVar5 = DecodeL3RSrcDstInstruction(MI,uVar9,(uint64_t)info,pvVar8);
    break;
  case 0x23:
    uVar11 = uVar11 << 10;
LAB_001c5bb0:
    uVar16 = (ulong)uVar11;
    uVar14 = uVar16 & 0xffff;
    goto LAB_001c5eaf;
  case 0x24:
    uVar11 = uVar11 << 10;
LAB_001c5e79:
    uVar16 = (ulong)uVar11;
    uVar14 = -(uVar16 & 0xffff);
LAB_001c5eaf:
    uVar11 = (uint)uVar16;
    MCOperand_CreateImm0(MI,uVar14);
    goto LAB_001c5eb8;
  }
  if (DVar5 == MCDisassembler_Fail) {
    local_4c = 0;
  }
LAB_001c5eb8:
  uVar4 = 2;
  if (local_4c == 0) {
    if (3 < code_len) {
      uVar11 = *(uint *)code;
    }
    uVar15 = 0;
    if (3 < code_len) {
      iVar19 = 3;
      puVar3 = DecoderTable32;
LAB_001c5f0c:
      puVar18 = puVar3;
      switch(*puVar18) {
      case '\x01':
        uVar15 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
        if (puVar18[2] == 0x20) {
          uVar15 = 0xffffffff;
        }
        uVar15 = (uVar15 & uVar11) >> (puVar18[1] & 0x1f);
        puVar3 = puVar18 + 3;
        goto LAB_001c5f0c;
      case '\x02':
        uVar14 = 0;
        uVar9 = 0;
        bVar7 = 0;
        do {
          lVar2 = uVar14 + 1;
          uVar9 = uVar9 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
          bVar7 = bVar7 + 7;
          uVar14 = uVar14 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3;
        if (uVar15 != uVar9) {
          puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3 +
                   *(ushort *)(puVar18 + (uVar14 & 0xffffffff) + 1);
        }
        goto LAB_001c5f0c;
      case '\x03':
        uVar9 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
        if (puVar18[2] == 0x20) {
          uVar9 = 0xffffffff;
        }
        uVar14 = 0;
        uVar12 = 0;
        bVar7 = 0;
        do {
          lVar2 = uVar14 + 3;
          uVar12 = uVar12 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
          bVar7 = bVar7 + 7;
          uVar14 = uVar14 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        puVar3 = puVar18 + (uVar14 & 0xffffffff) + 5;
        if ((uVar9 & uVar11) >> (puVar18[1] & 0x1f) != uVar12) {
          puVar3 = puVar18 + (uVar14 & 0xffffffff) + 5 +
                   *(ushort *)(puVar18 + (uVar14 & 0xffffffff) + 3);
        }
        goto LAB_001c5f0c;
      case '\x04':
        uVar14 = 0;
        do {
          lVar2 = uVar14 + 1;
          uVar14 = uVar14 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        puVar3 = puVar18 + (uVar14 & 0xffffffff) + 3;
        goto LAB_001c5f0c;
      case '\x05':
        goto switchD_001c5f22_caseD_5;
      case '\x06':
        uVar14 = 0;
        uVar9 = 0;
        bVar7 = 0;
        do {
          lVar2 = uVar14 + 1;
          uVar9 = uVar9 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
          bVar7 = bVar7 + 7;
          uVar14 = uVar14 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        uVar16 = 0;
        uVar12 = 0;
        bVar7 = 0;
        do {
          lVar2 = uVar16 + (uVar14 & 0xffffffff) + 1;
          uVar12 = uVar12 + ((puVar18[lVar2] & 0x7f) << (bVar7 & 0x1f));
          bVar7 = bVar7 + 7;
          uVar16 = uVar16 + 1;
        } while ((char)puVar18[lVar2] < '\0');
        puVar3 = puVar18 + (uVar16 & 0xffffffff) + (uVar14 & 0xffffffff) + 1;
        if ((uVar12 & ~uVar11) != 0 || (uVar9 & uVar11) != 0) {
          iVar19 = 1;
        }
        goto LAB_001c5f0c;
      default:
        goto switchD_001c5f22_default;
      }
    }
  }
  else {
LAB_001c5ec0:
    *size = uVar4;
    uVar15 = 1;
  }
LAB_001c646c:
  return SUB41(uVar15,0);
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return false;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return true;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return false;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}